

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Discoverer.cpp
# Opt level: O0

void __thiscall new_words_discover::Discoverer::print(Discoverer *this)

{
  byte bVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  long lVar5;
  ostream *poVar6;
  wostream *pwVar7;
  size_type sVar8;
  unsigned_long *puVar9;
  string local_338 [32];
  reference local_318;
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>
  *s;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  *__range1;
  string local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0 [32];
  wostream local_2b0 [8];
  wofstream output;
  string local_b0 [32];
  string local_90 [8];
  string out_file;
  size_type dot;
  allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>
  local_39;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_true>
  local_30;
  undefined1 local_28 [8];
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  sorted;
  Discoverer *this_local;
  
  sorted.
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
       ::begin(&this->words_);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
       ::end(&this->words_);
  std::
  allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>
  ::allocator(&local_39);
  std::
  vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>
  ::
  vector<std::__detail::_Node_iterator<std::pair<std::__cxx11::wstring_const,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,false,true>,void>
            ((vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>
              *)local_28,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_false,_true>
              )local_30._M_cur,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_false,_true>
              )local_38._M_cur,&local_39);
  std::
  allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>
  ::~allocator(&local_39);
  iVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
          ::begin((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                   *)local_28);
  iVar4 = std::
          vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                 *)local_28);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>*,std::vector<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>,std::allocator<std::pair<std::__cxx11::wstring,std::tuple<unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>>>>>,new_words_discover::Discoverer::print()::__0>
            (iVar3._M_current,iVar4._M_current);
  lVar5 = std::__cxx11::string::find_last_of((char)this + -0x70,0x2e);
  std::__cxx11::string::string(local_90);
  if (lVar5 == -1) {
    std::__cxx11::string::string(local_b0,(string *)&this->filename_);
  }
  else {
    std::__cxx11::string::substr((ulong)local_b0,(ulong)&this->filename_);
  }
  std::__cxx11::string::operator=(local_90,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::operator+=(local_90,"_out.txt");
  std::wofstream::wofstream(local_2b0,local_90,_S_out);
  bVar1 = std::wofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+((char *)local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Failed to open ");
    std::operator+(local_2d0,(char *)local_2f0);
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_2d0);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string(local_2f0);
  }
  else {
    pwVar7 = std::operator<<(local_2b0,L"Total words: ");
    sVar8 = std::
            vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
            ::size((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                    *)local_28);
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,sVar8);
    std::wostream::operator<<(pwVar7,std::endl<wchar_t,std::char_traits<wchar_t>>);
    __end1 = std::
             vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                      *)local_28);
    s = (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>
         *)std::
           vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
           ::end((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
                  *)local_28);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>_>
                                  *)&s);
      if (!bVar2) break;
      local_318 = __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>_>
                  ::operator*(&__end1);
      pwVar7 = std::operator<<(local_2b0,(wstring *)local_318);
      pwVar7 = std::operator<<(pwVar7,L" ");
      puVar9 = std::
               get<unsigned_long,unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>
                         (&local_318->second);
      pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,*puVar9);
      std::wostream::operator<<(pwVar7,std::endl<wchar_t,std::char_traits<wchar_t>>);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>_>
      ::operator++(&__end1);
    }
    std::operator+((char *)local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "The results are stored in ");
    poVar6 = std::operator<<((ostream *)&std::cout,local_338);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_338);
  }
  std::wofstream::~wofstream(local_2b0);
  std::__cxx11::string::~string(local_90);
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
             *)local_28);
  return;
}

Assistant:

void Discoverer::print()
{
    std::vector<std::pair<std::wstring, word_t>> sorted(words_.begin(), words_.end());
    std::sort(sorted.begin(), sorted.end(), [](auto &x, auto &y) {
        return std::get<frequency_t>(x.second) < std::get<frequency_t>(y.second);
    });

    // Generating output filename by input filename, remove suffix if any.
    auto dot = filename_.find_last_of('.');
    std::string out_file;
    out_file = (dot != std::string::npos ? filename_.substr(0, dot) : filename_);
    out_file += "_out.txt";
    std::wofstream output(out_file);
    if (!output.is_open()) {
        std::cerr << "Failed to open " + out_file + "!" << std::endl;
        return;
    }
    output << L"Total words: " << sorted.size() << std::endl;
    for (const auto &s : sorted) {
        output << s.first << L" " << std::get<frequency_t>(s.second) << std::endl;
    }
    std::cout << "The results are stored in " + out_file << std::endl;
}